

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

bool __thiscall RangeSize::propagate(RangeSize *this)

{
  IntVar *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  if ((this->y->min).v < 1) {
    if (so.lazy) {
      iVar3 = (*(this->y->super_Var).super_Branching._vptr_Branching[8])();
      lVar6 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar6 = 0;
    }
    iVar3 = (*(this->y->super_Var).super_Branching._vptr_Branching[0xe])(this->y,1,lVar6,1);
    if ((char)iVar3 != '\0') goto LAB_001b2a78;
LAB_001b2ae5:
    bVar2 = false;
  }
  else {
LAB_001b2a78:
    pIVar1 = this->x;
    lVar6 = ((long)(pIVar1->max).v - (long)(pIVar1->min).v) + 1;
    if ((int)lVar6 < (this->y->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
        uVar4 = (*(this->x->super_Var).super_Branching._vptr_Branching[9])();
        uVar5 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      }
      else {
        uVar5 = 0;
      }
      iVar3 = (*(this->y->super_Var).super_Branching._vptr_Branching[0xf])(this->y,lVar6,uVar5,1);
      if ((char)iVar3 == '\0') goto LAB_001b2ae5;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool propagate() override {
		if (y->getMin() < 1) {
			setDom((*y), setMin, 1, y->getMinLit());
		}
		setDom((*y), setMax, x->getMax() - x->getMin() + 1, x->getMinLit(), x->getMaxLit());
		return true;
	}